

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

TypeID NULLCTypeInfo::TypeArgumentType(int argument,int *typeID)

{
  ExternTypeInfo *pEVar1;
  ExternMemberInfo *pEVar2;
  char *pcVar3;
  uint uVar4;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar1->subCat == CAT_FUNCTION) {
      if ((uint)argument < (pEVar1->field_8).arrSize) {
        pEVar2 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           ((FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210),0);
        uVar4 = pEVar2[(pEVar1->field_11).subType + argument + 1].type;
      }
      else {
        pcVar3 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName)
        ;
        uVar4 = 0;
        nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)"
                        ,pcVar3,(ulong)(pEVar1->field_8).arrSize);
      }
    }
    else {
      pcVar3 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      uVar4 = 0;
      nullcThrowError("typeid::argumentType received type (%s) that is not a function",pcVar3);
    }
    return (TypeID)uVar4;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xf8,"TypeID NULLCTypeInfo::TypeArgumentType(int, int *)");
}

Assistant:

TypeID TypeArgumentType(int argument, int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::argumentType received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		if((unsigned int)argument >= type.memberCount)
		{
			nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)", &linker->exSymbols[type.offsetToName], type.memberCount);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[type.memberOffset + argument + 1].type);
	}